

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void phyr::latinHypercube(double *sample,int nSamples,int nDimensions,RNG *rng)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  uint32_t b;
  ulong uVar6;
  double *pdVar7;
  int j;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  uVar5 = 0;
  uVar6 = 0;
  if (0 < nDimensions) {
    uVar6 = (ulong)(uint)nDimensions;
  }
  uVar2 = 0;
  if (0 < nSamples) {
    uVar2 = (ulong)(uint)nSamples;
  }
  pdVar4 = sample;
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      dVar9 = RNG::uniformReal(rng);
      dVar10 = (dVar9 + (double)(int)uVar5) * (1.0 / (double)nSamples);
      dVar9 = 0.9999999999999999;
      if (dVar10 <= 0.9999999999999999) {
        dVar9 = dVar10;
      }
      pdVar4[uVar8] = dVar9;
    }
    pdVar4 = pdVar4 + nDimensions;
  }
  pdVar4 = sample;
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    pdVar7 = pdVar4;
    b = nSamples;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = RNG::uniformUInt32(rng,b);
      lVar3 = (long)(int)((uVar1 + (int)uVar8) * nDimensions);
      dVar9 = *pdVar7;
      *pdVar7 = sample[uVar5 + lVar3];
      sample[uVar5 + lVar3] = dVar9;
      b = b - 1;
      pdVar7 = pdVar7 + nDimensions;
    }
    pdVar4 = pdVar4 + 1;
  }
  return;
}

Assistant:

void latinHypercube(Real* sample, int nSamples, int nDimensions, RNG& rng) {
    // Generate LHS samples along the diagonal
    Real invSamples = Real(1) / nSamples;
    for (int i = 0; i < nSamples; i++) {
        for (int j = 0; j < nDimensions; j++) {
            Real offset = (i + rng.uniformReal()) * invSamples;
            sample[nDimensions * i + j] = std::min(offset, OneMinusEpsilon);
        }
    }

    // Permute LHS samples in each dimension
    for (int i = 0; i < nDimensions; i++) {
        for (int j = 0; j < nSamples; j++) {
            int swapIdx = j + rng.uniformUInt32(nSamples - j);
            std::swap(sample[nDimensions * j + i], sample[nDimensions * swapIdx + i]);
        }
    }
}